

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

Test * GraphTestImplicitOutputOnlyParse::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x230);
  GraphTestImplicitOutputOnlyParse((GraphTestImplicitOutputOnlyParse *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(GraphTest, ImplicitOutputOnlyParse) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build | out.imp: cat in\n"));

  Edge* edge = GetNode("out.imp")->in_edge();
  EXPECT_EQ(1, edge->outputs_.size());
  EXPECT_EQ("out.imp", edge->outputs_[0]->path());
  EXPECT_EQ(1, edge->implicit_outs_);
  EXPECT_EQ(edge, GetNode("out.imp")->in_edge());
}